

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O1

void __thiscall
bsplib::Rdma::hpput(Rdma *this,void *src,int dst_pid,Memslot dst_slot,size_t dst_offset,size_t size)

{
  pointer ppvVar1;
  pointer ppvVar2;
  ssize_t sVar3;
  int __flags;
  size_t sVar4;
  TicToc t;
  Action action;
  TicToc local_88;
  undefined8 local_68;
  int iStack_60;
  int iStack_5c;
  int local_58;
  Memslot local_50;
  Memslot local_48;
  size_t local_40;
  size_t local_38;
  
  sVar4 = dst_offset;
  local_88.m_record = TicToc::push(HPPUT);
  __flags = (int)sVar4;
  clock_gettime(1,(timespec *)&local_68);
  local_88.m_start.tv_sec = (__time_t)local_68;
  local_88.m_nbytes = 0;
  if (size < this->m_min_n_hp_msg_size) {
    put(this,src,dst_pid,dst_slot,dst_offset,size);
  }
  else {
    if (((this->m_used_slots).
         super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>._M_impl
         .super__Vector_impl_data._M_start[(long)this->m_nprocs * dst_slot + (long)this->m_pid].
         status & 1) != 0) {
      __assert_fail("! (slot( m_pid, dst_slot ).status & Memblock::PUSHED)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                    ,0x68,"void bsplib::Rdma::hpput(const void *, int, Memslot, size_t, size_t)");
    }
    ppvVar1 = (this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppvVar2 = (this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_68 = src;
    std::vector<void*,std::allocator<void*>>::emplace_back<void*>
              ((vector<void*,std::allocator<void*>> *)&this->m_local_slots,(void **)&local_68);
    sVar3 = Unbuf::send(&this->m_unbuf,dst_pid,src,size,__flags);
    local_50 = (long)ppvVar1 - (long)ppvVar2 >> 3;
    local_68 = (void *)CONCAT44(dst_pid,1);
    iStack_60 = this->m_pid;
    local_58 = (int)sVar3;
    iStack_5c = dst_pid;
    local_48 = dst_slot;
    local_40 = dst_offset;
    local_38 = size;
    ActionBuf::push_back(&this->m_send_actions,(Action *)&local_68);
  }
  TicToc::~TicToc(&local_88);
  return;
}

Assistant:

void Rdma::hpput( const void * src,
        int dst_pid, Memslot dst_slot, size_t dst_offset, size_t size )
{
#ifdef PROFILE
    TicToc t( TicToc::HPPUT );
#endif
    if ( size < m_min_n_hp_msg_size ) { 
        put( src, dst_pid, dst_slot, dst_offset, size );
        return;
    }

    assert( ! (slot( m_pid, dst_slot ).status & Memblock::PUSHED) );
    
    Memslot src_slot = m_local_slots.size();
    m_local_slots.push_back( const_cast<void *>(src) );

    int tag = m_unbuf.send( dst_pid, src, size );

    Action action = { Action::HPPUT, dst_pid, m_pid, dst_pid,
                      tag, src_slot, dst_slot , dst_offset, size };
    m_send_actions.push_back( action );
}